

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O0

span<const_lf::mesh::Orientation,_18446744073709551615UL> __thiscall
lf::mesh::hybrid2d::Point::RelativeOrientations(Point *this)

{
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [376];
  Point *local_10;
  Point *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"A point has not sub-entities");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"false",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/point.h"
             ,&local_1f1);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1c8,&local_1f0,0x4d,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"false",&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/point.h"
             ,&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"",&local_289);
  lf::base::AssertionFailed(&local_238,&local_260,0x4d,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  abort();
}

Assistant:

[[nodiscard]] std::span<const lf::mesh::Orientation> RelativeOrientations()
      const override {
    LF_ASSERT_MSG(false, "A point has not sub-entities");
    return std::span<Orientation>();
  }